

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chipset.c
# Opt level: O0

int pfb_type(int chipset)

{
  undefined4 local_c;
  int chipset_local;
  
  if (chipset < 3) {
    local_c = 1;
  }
  else if (chipset < 0x10) {
    local_c = 2;
  }
  else if ((chipset < 0x1a) || (chipset == 0x34)) {
    local_c = 3;
  }
  else if (chipset < 0x20) {
    local_c = 0;
  }
  else if (chipset < 0x40) {
    local_c = 4;
  }
  else if ((chipset == 0x40) || (chipset == 0x45)) {
    local_c = 5;
  }
  else if ((chipset == 0x44) || (((chipset == 0x46 || (chipset == 0x4a)) || (0x4b < chipset)))) {
    if ((chipset == 0x50) || (0x7f < chipset)) {
      if (chipset < 0xc0) {
        local_c = 8;
      }
      else {
        local_c = 9;
      }
    }
    else {
      local_c = 7;
    }
  }
  else {
    local_c = 6;
  }
  return local_c;
}

Assistant:

int pfb_type(int chipset) {
	if (chipset <3)
		return PFB_NV01;
	if (chipset < 0x10)
		return PFB_NV03;
	if (chipset < 0x1a || chipset == 0x34)
		return PFB_NV10;
	if (chipset < 0x20)
		return PFB_NONE; /* IGP */
	if (chipset < 0x40)
		return PFB_NV20;
	if (chipset == 0x40 || chipset == 0x45)
		return PFB_NV40;
	if (chipset != 0x44 && chipset != 0x46 && chipset != 0x4a && chipset < 0x4c)
		return PFB_NV41;
	if (chipset != 0x50 && chipset < 0x80)
		return PFB_NV44;
	if (chipset < 0xc0)
		return PFB_NV50;
	return PFB_NVC0;
}